

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# longint.c
# Opt level: O1

pLongInt longint_difference(pLongInt a,pLongInt b)

{
  pLongInt pLVar1;
  
  pLVar1 = create_longint();
  if (pLVar1 == (pLongInt)0x0) {
    puts("longint_difference: create_longint failed");
    pLVar1 = (pLongInt)0x0;
  }
  else {
    pLVar1->num = a->num - b->num;
  }
  return pLVar1;
}

Assistant:

pLongInt longint_difference(pLongInt a, pLongInt b)
{
    pLongInt res = create_longint();
    if (res == NULL)
    {
        log("longint_difference: create_longint failed");
        return NULL;
    }
    res->num = a->num - b->num;
    return res;
}